

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5CInstIterNext(CInstIter *pIter)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int io;
  int ic;
  int ip;
  int local_3c;
  int local_38;
  int local_34;
  
  pIter->iStart = -1;
  pIter->iEnd = -1;
  iVar1 = 0;
  do {
    do {
      if (iVar1 != 0) {
        return iVar1;
      }
      if (pIter->nInst <= pIter->iInst) {
        return 0;
      }
      iVar1 = (*pIter->pApi->xInst)(pIter->pFts,pIter->iInst,&local_34,&local_38,&local_3c);
      iVar3 = local_3c;
    } while (iVar1 != 0);
    if (local_38 == pIter->iCol) {
      iVar2 = (*pIter->pApi->xPhraseSize)(pIter->pFts,local_34);
      iVar3 = iVar2 + iVar3 + -1;
      if (pIter->iStart < 0) {
        pIter->iStart = local_3c;
      }
      else {
        if (pIter->iEnd < local_3c) {
          return 0;
        }
        if (iVar3 <= pIter->iEnd) goto LAB_001c1ea8;
      }
      pIter->iEnd = iVar3;
    }
LAB_001c1ea8:
    pIter->iInst = pIter->iInst + 1;
  } while( true );
}

Assistant:

static int fts5CInstIterNext(CInstIter *pIter){
  int rc = SQLITE_OK;
  pIter->iStart = -1;
  pIter->iEnd = -1;

  while( rc==SQLITE_OK && pIter->iInst<pIter->nInst ){
    int ip; int ic; int io;
    rc = pIter->pApi->xInst(pIter->pFts, pIter->iInst, &ip, &ic, &io);
    if( rc==SQLITE_OK ){
      if( ic==pIter->iCol ){
        int iEnd = io - 1 + pIter->pApi->xPhraseSize(pIter->pFts, ip);
        if( pIter->iStart<0 ){
          pIter->iStart = io;
          pIter->iEnd = iEnd;
        }else if( io<=pIter->iEnd ){
          if( iEnd>pIter->iEnd ) pIter->iEnd = iEnd;
        }else{
          break;
        }
      }
      pIter->iInst++;
    }
  }

  return rc;
}